

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_decorations.cpp
# Opt level: O0

spv_result_t
spvtools::val::anon_unknown_0::CheckComponentDecoration
          (ValidationState_t *vstate,Instruction *inst,Decoration *decoration)

{
  Decoration *this;
  bool bVar1;
  uint32_t uVar2;
  int iVar3;
  Op OVar4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar5;
  size_type sVar6;
  DiagnosticStream *pDVar7;
  spv_const_context psVar8;
  Instruction *this_00;
  const_reference pvVar9;
  StorageClass local_11f4;
  uint local_11ec;
  string local_11e8;
  DiagnosticStream local_11c8;
  uint local_fec;
  undefined1 local_fe8 [4];
  uint sum_component_1;
  DiagnosticStream local_fc8;
  string local_df0;
  DiagnosticStream local_dd0;
  uint local_bf4;
  string local_bf0;
  DiagnosticStream local_bd0;
  uint local_9f4;
  uint32_t local_9f0;
  uint sum_component;
  uint32_t bit_width;
  uint32_t dimension;
  DiagnosticStream local_9c8;
  uint local_7ec;
  undefined1 local_7e8 [4];
  value_type component;
  string local_7c8;
  DiagnosticStream local_7a8;
  DiagnosticStream local_5d0;
  Instruction *local_3f8;
  Instruction *pointer;
  DiagnosticStream local_3e8;
  StorageClass local_20c;
  undefined1 local_208 [4];
  StorageClass storage_class;
  Op local_30;
  uint32_t local_2c;
  Op opcode;
  uint32_t type_id;
  Decoration *decoration_local;
  Instruction *inst_local;
  ValidationState_t *vstate_local;
  
  _opcode = decoration;
  decoration_local = (Decoration *)inst;
  inst_local = (Instruction *)vstate;
  uVar2 = Instruction::id(inst);
  if (uVar2 == 0) {
    __assert_fail("inst.id() && \"Parser ensures the target of the decoration has an ID\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_decorations.cpp"
                  ,0x72a,
                  "spv_result_t spvtools::val::(anonymous namespace)::CheckComponentDecoration(ValidationState_t &, const Instruction &, const Decoration &)"
                 );
  }
  pvVar5 = Decoration::params(_opcode);
  sVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pvVar5);
  if (sVar6 != 1) {
    __assert_fail("decoration.params().size() == 1 && \"Grammar ensures Component has one parameter\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_decorations.cpp"
                  ,0x72c,
                  "spv_result_t spvtools::val::(anonymous namespace)::CheckComponentDecoration(ValidationState_t &, const Instruction &, const Decoration &)"
                 );
  }
  iVar3 = Decoration::struct_member_index(_opcode);
  if (iVar3 == -1) {
    local_30 = Instruction::opcode((Instruction *)decoration_local);
    if ((local_30 != OpVariable) && (local_30 != OpFunctionParameter)) {
      ValidationState_t::diag
                ((DiagnosticStream *)local_208,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,
                 (Instruction *)decoration_local);
      pDVar7 = DiagnosticStream::operator<<
                         ((DiagnosticStream *)local_208,
                          (char (*) [104])
                          "Target of Component decoration must be a memory object declaration (a variable or a function parameter)"
                         );
      vstate_local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar7);
      DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
      return vstate_local._4_4_;
    }
    if (local_30 == OpVariable) {
      local_11f4 = Instruction::GetOperandAs<spv::StorageClass>((Instruction *)decoration_local,2);
    }
    else {
      local_11f4 = Max;
    }
    local_20c = local_11f4;
    if (((local_11f4 != Input) && (local_11f4 != Output)) && (local_11f4 != Max)) {
      ValidationState_t::diag
                (&local_3e8,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,
                 (Instruction *)decoration_local);
      pDVar7 = DiagnosticStream::operator<<
                         (&local_3e8,
                          (char (*) [120])
                          "Target of Component decoration is invalid: must point to a Storage Class of Input(1) or Output(3). Found Storage Class "
                         );
      pointer._4_4_ = local_20c;
      pDVar7 = DiagnosticStream::operator<<(pDVar7,(uint *)((long)&pointer + 4));
      vstate_local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar7);
      DiagnosticStream::~DiagnosticStream(&local_3e8);
      return vstate_local._4_4_;
    }
    local_2c = Instruction::type_id((Instruction *)decoration_local);
    bVar1 = ValidationState_t::IsPointerType((ValidationState_t *)inst_local,local_2c);
    if (bVar1) {
      local_3f8 = ValidationState_t::FindDef((ValidationState_t *)inst_local,local_2c);
      local_2c = Instruction::GetOperandAs<unsigned_int>(local_3f8,2);
    }
  }
  else {
    OVar4 = Instruction::opcode((Instruction *)decoration_local);
    this = decoration_local;
    if (OVar4 != OpTypeStruct) {
      ValidationState_t::diag
                (&local_5d0,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,
                 (Instruction *)decoration_local);
      pDVar7 = DiagnosticStream::operator<<
                         (&local_5d0,
                          (char (*) [76])
                          "Attempted to get underlying data type via member index for non-struct type."
                         );
      vstate_local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar7);
      DiagnosticStream::~DiagnosticStream(&local_5d0);
      return vstate_local._4_4_;
    }
    iVar3 = Decoration::struct_member_index(_opcode);
    local_2c = Instruction::word((Instruction *)this,(long)(iVar3 + 2));
  }
  psVar8 = ValidationState_t::context((ValidationState_t *)inst_local);
  bVar1 = spvIsVulkanEnv(psVar8->target_env);
  if (bVar1) {
    OVar4 = ValidationState_t::GetIdOpcode((ValidationState_t *)inst_local,local_2c);
    if (OVar4 == OpTypeArray) {
      this_00 = ValidationState_t::FindDef((ValidationState_t *)inst_local,local_2c);
      local_2c = Instruction::word(this_00,2);
    }
    bVar1 = ValidationState_t::IsIntScalarOrVectorType((ValidationState_t *)inst_local,local_2c);
    if ((!bVar1) &&
       (bVar1 = ValidationState_t::IsFloatScalarOrVectorType
                          ((ValidationState_t *)inst_local,local_2c), !bVar1)) {
      ValidationState_t::diag
                (&local_7a8,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,
                 (Instruction *)decoration_local);
      ValidationState_t::VkErrorID_abi_cxx11_
                (&local_7c8,(ValidationState_t *)inst_local,0x133c,(char *)0x0);
      pDVar7 = DiagnosticStream::operator<<(&local_7a8,&local_7c8);
      pDVar7 = DiagnosticStream::operator<<
                         (pDVar7,(char (*) [41])"Component decoration specified for type ");
      ValidationState_t::getIdName_abi_cxx11_
                ((string *)local_7e8,(ValidationState_t *)inst_local,local_2c);
      pDVar7 = DiagnosticStream::operator<<
                         (pDVar7,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_7e8);
      pDVar7 = DiagnosticStream::operator<<(pDVar7,(char (*) [32])" that is not a scalar or vector")
      ;
      vstate_local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar7);
      std::__cxx11::string::~string((string *)local_7e8);
      std::__cxx11::string::~string((string *)&local_7c8);
      DiagnosticStream::~DiagnosticStream(&local_7a8);
      return vstate_local._4_4_;
    }
    pvVar5 = Decoration::params(_opcode);
    pvVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](pvVar5,0);
    local_7ec = *pvVar9;
    if (3 < local_7ec) {
      ValidationState_t::diag
                (&local_9c8,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,
                 (Instruction *)decoration_local);
      ValidationState_t::VkErrorID_abi_cxx11_
                ((string *)&bit_width,(ValidationState_t *)inst_local,0x1338,(char *)0x0);
      pDVar7 = DiagnosticStream::operator<<
                         (&local_9c8,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &bit_width);
      pDVar7 = DiagnosticStream::operator<<
                         (pDVar7,(char (*) [54])
                                 "Component decoration value must not be greater than 3");
      vstate_local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar7);
      std::__cxx11::string::~string((string *)&bit_width);
      DiagnosticStream::~DiagnosticStream(&local_9c8);
      return vstate_local._4_4_;
    }
    sum_component = ValidationState_t::GetDimension((ValidationState_t *)inst_local,local_2c);
    local_9f0 = ValidationState_t::GetBitWidth((ValidationState_t *)inst_local,local_2c);
    if ((local_9f0 == 0x10) || (local_9f0 == 0x20)) {
      local_9f4 = local_7ec + sum_component;
      if (4 < local_9f4) {
        ValidationState_t::diag
                  (&local_bd0,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,
                   (Instruction *)decoration_local);
        ValidationState_t::VkErrorID_abi_cxx11_
                  (&local_bf0,(ValidationState_t *)inst_local,0x1339,(char *)0x0);
        pDVar7 = DiagnosticStream::operator<<(&local_bd0,&local_bf0);
        pDVar7 = DiagnosticStream::operator<<
                           (pDVar7,(char (*) [38])"Sequence of components starting with ");
        pDVar7 = DiagnosticStream::operator<<(pDVar7,&local_7ec);
        pDVar7 = DiagnosticStream::operator<<(pDVar7,(char (*) [18])" and ending with ");
        local_bf4 = local_9f4 - 1;
        pDVar7 = DiagnosticStream::operator<<(pDVar7,&local_bf4);
        pDVar7 = DiagnosticStream::operator<<(pDVar7,(char (*) [20])" gets larger than 3");
        vstate_local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar7);
        std::__cxx11::string::~string((string *)&local_bf0);
        DiagnosticStream::~DiagnosticStream(&local_bd0);
        return vstate_local._4_4_;
      }
    }
    else if (local_9f0 == 0x40) {
      if (2 < sum_component) {
        ValidationState_t::diag
                  (&local_dd0,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,
                   (Instruction *)decoration_local);
        ValidationState_t::VkErrorID_abi_cxx11_
                  (&local_df0,(ValidationState_t *)inst_local,0x1e17,(char *)0x0);
        pDVar7 = DiagnosticStream::operator<<(&local_dd0,&local_df0);
        pDVar7 = DiagnosticStream::operator<<
                           (pDVar7,(char (*) [74])
                                   "Component decoration only allowed on 64-bit scalar and 2-component vector"
                           );
        vstate_local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar7);
        std::__cxx11::string::~string((string *)&local_df0);
        DiagnosticStream::~DiagnosticStream(&local_dd0);
        return vstate_local._4_4_;
      }
      if ((local_7ec == 1) || (local_7ec == 3)) {
        ValidationState_t::diag
                  (&local_fc8,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,
                   (Instruction *)decoration_local);
        ValidationState_t::VkErrorID_abi_cxx11_
                  ((string *)local_fe8,(ValidationState_t *)inst_local,0x133b,(char *)0x0);
        pDVar7 = DiagnosticStream::operator<<
                           (&local_fc8,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_fe8);
        pDVar7 = DiagnosticStream::operator<<
                           (pDVar7,(char (*) [68])
                                   "Component decoration value must not be 1 or 3 for 64-bit data types"
                           );
        vstate_local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar7);
        std::__cxx11::string::~string((string *)local_fe8);
        DiagnosticStream::~DiagnosticStream(&local_fc8);
        return vstate_local._4_4_;
      }
      local_fec = local_7ec + sum_component * 2;
      if (4 < local_fec) {
        ValidationState_t::diag
                  (&local_11c8,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,
                   (Instruction *)decoration_local);
        ValidationState_t::VkErrorID_abi_cxx11_
                  (&local_11e8,(ValidationState_t *)inst_local,0x133a,(char *)0x0);
        pDVar7 = DiagnosticStream::operator<<(&local_11c8,&local_11e8);
        pDVar7 = DiagnosticStream::operator<<
                           (pDVar7,(char (*) [38])"Sequence of components starting with ");
        pDVar7 = DiagnosticStream::operator<<(pDVar7,&local_7ec);
        pDVar7 = DiagnosticStream::operator<<(pDVar7,(char (*) [18])" and ending with ");
        local_11ec = local_fec - 1;
        pDVar7 = DiagnosticStream::operator<<(pDVar7,&local_11ec);
        pDVar7 = DiagnosticStream::operator<<(pDVar7,(char (*) [20])" gets larger than 3");
        vstate_local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar7);
        std::__cxx11::string::~string((string *)&local_11e8);
        DiagnosticStream::~DiagnosticStream(&local_11c8);
        return vstate_local._4_4_;
      }
    }
  }
  return SPV_SUCCESS;
}

Assistant:

spv_result_t CheckComponentDecoration(ValidationState_t& vstate,
                                      const Instruction& inst,
                                      const Decoration& decoration) {
  assert(inst.id() && "Parser ensures the target of the decoration has an ID");
  assert(decoration.params().size() == 1 &&
         "Grammar ensures Component has one parameter");

  uint32_t type_id;
  if (decoration.struct_member_index() == Decoration::kInvalidMember) {
    // The target must be a memory object declaration.
    const auto opcode = inst.opcode();
    if (opcode != spv::Op::OpVariable &&
        opcode != spv::Op::OpFunctionParameter) {
      return vstate.diag(SPV_ERROR_INVALID_ID, &inst)
             << "Target of Component decoration must be a memory object "
                "declaration (a variable or a function parameter)";
    }

    // Only valid for the Input and Output Storage Classes.
    const auto storage_class = opcode == spv::Op::OpVariable
                                   ? inst.GetOperandAs<spv::StorageClass>(2)
                                   : spv::StorageClass::Max;
    if (storage_class != spv::StorageClass::Input &&
        storage_class != spv::StorageClass::Output &&
        storage_class != spv::StorageClass::Max) {
      return vstate.diag(SPV_ERROR_INVALID_ID, &inst)
             << "Target of Component decoration is invalid: must point to a "
                "Storage Class of Input(1) or Output(3). Found Storage "
                "Class "
             << uint32_t(storage_class);
    }

    type_id = inst.type_id();
    if (vstate.IsPointerType(type_id)) {
      const auto pointer = vstate.FindDef(type_id);
      type_id = pointer->GetOperandAs<uint32_t>(2);
    }
  } else {
    if (inst.opcode() != spv::Op::OpTypeStruct) {
      return vstate.diag(SPV_ERROR_INVALID_DATA, &inst)
             << "Attempted to get underlying data type via member index for "
                "non-struct type.";
    }
    type_id = inst.word(decoration.struct_member_index() + 2);
  }

  if (spvIsVulkanEnv(vstate.context()->target_env)) {
    // Strip the array, if present.
    if (vstate.GetIdOpcode(type_id) == spv::Op::OpTypeArray) {
      type_id = vstate.FindDef(type_id)->word(2u);
    }

    if (!vstate.IsIntScalarOrVectorType(type_id) &&
        !vstate.IsFloatScalarOrVectorType(type_id)) {
      return vstate.diag(SPV_ERROR_INVALID_ID, &inst)
             << vstate.VkErrorID(4924)
             << "Component decoration specified for type "
             << vstate.getIdName(type_id) << " that is not a scalar or vector";
    }

    const auto component = decoration.params()[0];
    if (component > 3) {
      return vstate.diag(SPV_ERROR_INVALID_ID, &inst)
             << vstate.VkErrorID(4920)
             << "Component decoration value must not be greater than 3";
    }

    const auto dimension = vstate.GetDimension(type_id);
    const auto bit_width = vstate.GetBitWidth(type_id);
    if (bit_width == 16 || bit_width == 32) {
      const auto sum_component = component + dimension;
      if (sum_component > 4) {
        return vstate.diag(SPV_ERROR_INVALID_ID, &inst)
               << vstate.VkErrorID(4921)
               << "Sequence of components starting with " << component
               << " and ending with " << (sum_component - 1)
               << " gets larger than 3";
      }
    } else if (bit_width == 64) {
      if (dimension > 2) {
        return vstate.diag(SPV_ERROR_INVALID_ID, &inst)
               << vstate.VkErrorID(7703)
               << "Component decoration only allowed on 64-bit scalar and "
                  "2-component vector";
      }
      if (component == 1 || component == 3) {
        return vstate.diag(SPV_ERROR_INVALID_ID, &inst)
               << vstate.VkErrorID(4923)
               << "Component decoration value must not be 1 or 3 for 64-bit "
                  "data types";
      }
      // 64-bit is double per component dimension
      const auto sum_component = component + (2 * dimension);
      if (sum_component > 4) {
        return vstate.diag(SPV_ERROR_INVALID_ID, &inst)
               << vstate.VkErrorID(4922)
               << "Sequence of components starting with " << component
               << " and ending with " << (sum_component - 1)
               << " gets larger than 3";
      }
    }
  }

  return SPV_SUCCESS;
}